

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O0

void setUp(void)

{
  fff.call_history_idx = 0;
  memset(&fff,0,400);
  epoll_create1_reset();
  eventfd_reset();
  epoll_ctl_reset();
  epoll_wait_reset();
  close_reset();
  epoll_callback_reset();
  epoll_callback_second_fd_reset();
  epoll_callback_third_fd_reset();
  epoll_callback_forth_fd_reset();
  epoll_callback_remove_third_fd_reset();
  epoll_callback_remove_loop_reset();
  epoll_callback_unregister_read_second_fd_reset();
  events_in_list = 0;
  return;
}

Assistant:

void setUp(void)
{
	FFF_RESET_HISTORY()

	RESET_FAKE(epoll_create1)
	RESET_FAKE(eventfd)
	RESET_FAKE(epoll_ctl)
	RESET_FAKE(epoll_wait)
	RESET_FAKE(close)
	RESET_FAKE(epoll_callback)
	RESET_FAKE(epoll_callback_second_fd)
	RESET_FAKE(epoll_callback_third_fd)
	RESET_FAKE(epoll_callback_forth_fd)
	RESET_FAKE(epoll_callback_remove_third_fd)
	RESET_FAKE(epoll_callback_remove_loop)
	RESET_FAKE(epoll_callback_unregister_read_second_fd)
	events_in_list = 0;
}